

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::BinaryLambdaWrapper,bool,duckdb::date_t(*)(duckdb::date_t,duckdb::date_t),false,false>
               (date_t *ldata,date_t *rdata,date_t *result_data,idx_t count,ValidityMask *mask,
               _func_date_t_date_t_date_t *fun)

{
  undefined4 uVar1;
  bool bVar2;
  date_t dVar3;
  _func_date_t_date_t_date_t *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  date_t rentry_2;
  date_t lentry_2;
  idx_t i;
  date_t rentry_1;
  date_t lentry_1;
  idx_t start;
  date_t rentry;
  date_t lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  undefined4 in_stack_ffffffffffffff50;
  date_t in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  _func_date_t_date_t_date_t *in_stack_ffffffffffffff60;
  _func_date_t_date_t_date_t *fun_00;
  date_t in_stack_ffffffffffffff6c;
  date_t in_stack_ffffffffffffff70;
  idx_t local_80;
  unsigned_long local_78;
  undefined4 local_6c;
  undefined4 local_68;
  int32_t local_64;
  undefined4 local_60;
  undefined4 local_5c;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  TemplatedValidityMask<unsigned_long> *local_28;
  _func_date_t_date_t_date_t *local_20;
  void *local_18;
  void *local_10;
  void *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + (long)in_RCX * 4),in_RDX,
             (void *)((long)in_RDX + (long)in_RCX * 4),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x4d);
  AssertRestrictFunction
            (local_10,(void *)((long)local_10 + (long)local_20 * 4),local_18,
             (void *)((long)local_18 + (long)local_20 * 4),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar2) {
    for (fun_00 = (_func_date_t_date_t_date_t *)0x0; fun_00 < local_20; fun_00 = fun_00 + 1) {
      uVar1 = *(undefined4 *)((long)local_8 + (long)fun_00 * 4);
      in_stack_ffffffffffffff54 =
           BinaryLambdaWrapper::
           Operation<duckdb::date_t(*)(duckdb::date_t,duckdb::date_t),bool,duckdb::date_t,duckdb::date_t,duckdb::date_t>
                     (fun_00,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                      (ValidityMask *)
                      CONCAT44(uVar1,*(undefined4 *)((long)local_10 + (long)fun_00 * 4)),
                      CONCAT44(in_stack_ffffffffffffff54.days,uVar1));
      *(int32_t *)((long)local_18 + (long)fun_00 * 4) = in_stack_ffffffffffffff54.days;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0x500ea5);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           ((TemplatedValidityMask<unsigned_long> *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            CONCAT44(in_stack_ffffffffffffff54.days,in_stack_ffffffffffffff50));
      local_58 = MinValue<unsigned_long>(local_38 + 0x40,(unsigned_long)local_20);
      bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar2) {
        for (; local_38 < local_58; local_38 = local_38 + 1) {
          local_68 = *(undefined4 *)((long)local_8 + local_38 * 4);
          local_6c = *(undefined4 *)((long)local_10 + local_38 * 4);
          local_60 = local_6c;
          local_5c = local_68;
          local_64 = (int32_t)BinaryLambdaWrapper::
                              Operation<duckdb::date_t(*)(duckdb::date_t,duckdb::date_t),bool,duckdb::date_t,duckdb::date_t,duckdb::date_t>
                                        (in_stack_ffffffffffffff60,in_stack_ffffffffffffff70,
                                         in_stack_ffffffffffffff6c,
                                         (ValidityMask *)
                                         CONCAT44(in_stack_ffffffffffffff5c,
                                                  in_stack_ffffffffffffff58),
                                         CONCAT44(in_stack_ffffffffffffff54.days,
                                                  in_stack_ffffffffffffff50));
          *(int32_t *)((long)local_18 + local_38 * 4) = local_64;
        }
      }
      else {
        bVar2 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar2) {
          local_38 = local_58;
        }
        else {
          local_78 = local_38;
          for (; local_38 < local_58; local_38 = local_38 + 1) {
            local_80 = local_38 - local_78;
            bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_80);
            if (bVar2) {
              in_stack_ffffffffffffff70.days = *(int32_t *)((long)local_8 + local_38 * 4);
              in_stack_ffffffffffffff6c.days = *(int32_t *)((long)local_10 + local_38 * 4);
              dVar3 = BinaryLambdaWrapper::
                      Operation<duckdb::date_t(*)(duckdb::date_t,duckdb::date_t),bool,duckdb::date_t,duckdb::date_t,duckdb::date_t>
                                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff70,
                                 in_stack_ffffffffffffff6c,
                                 (ValidityMask *)
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                 CONCAT44(in_stack_ffffffffffffff54.days,in_stack_ffffffffffffff50))
              ;
              *(int32_t *)((long)local_18 + local_38 * 4) = dVar3.days;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}